

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase349::run(TestCase349 *this)

{
  undefined8 uVar1;
  Which WVar2;
  MonotonicClock *clock;
  socklen_t __len;
  sockaddr *__addr;
  ReaderOptions receiveOptions;
  Own<capnp::OutgoingRpcMessage,_std::nullptr_t> msg;
  undefined1 local_5f8 [32];
  anon_union_16_1_a8a2e026_for_OneOf<capnp::MessageStream_*,_kj::Own<capnp::MessageStream,_std::nullptr_t>_>_2
  local_5d8;
  Builder body;
  Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
  local_598;
  DebugComparison<capnp::rpc::Message::Which,_capnp::rpc::Message::Which> _kjCondition;
  int handleCount;
  int callCount;
  char *local_558;
  undefined *puStack_550;
  void *local_548;
  char *local_540;
  undefined *puStack_538;
  void *local_530;
  PipeThread serverThread;
  AsyncIoContext ioContext;
  Builder hostId;
  MallocMessageBuilder refMessage;
  TwoPartyVatNetwork network;
  
  kj::setupAsyncIo();
  callCount = 0;
  handleCount = 0;
  runServer(&serverThread,ioContext.provider.ptr,&callCount,&handleCount);
  clock = kj::systemCoarseMonotonicClock();
  receiveOptions._8_8_ = 0x40;
  receiveOptions.traversalLimitInWords = 0x800000;
  __len = 0x800000;
  TwoPartyVatNetwork::TwoPartyVatNetwork(&network,serverThread.pipe.ptr,CLIENT,receiveOptions,clock)
  ;
  MallocMessageBuilder::MallocMessageBuilder(&refMessage,0x80,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnp::rpc::twoparty::VatId>(&hostId,&refMessage.super_MessageBuilder);
  *(undefined2 *)hostId._builder.data = 0;
  StructBuilder::asReader(&hostId._builder);
  TwoPartyVatNetwork::connect((TwoPartyVatNetwork *)local_5f8,(int)&network,__addr,__len);
  _kjCondition.left = local_5f8._0_2_;
  _kjCondition.right = local_5f8._2_2_;
  _kjCondition._4_4_ = local_5f8._4_4_;
  _kjCondition.op.content.ptr = (char *)local_5f8._8_8_;
  local_5f8._8_8_ = (_func_int **)0x0;
  kj::
  Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
  ::dispose((Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
             *)local_5f8);
  if (_kjCondition.op.content.ptr == (char *)0x0) {
    kj::_::Debug::Fault::Fault
              ((Fault *)local_5f8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x16b,FAILED,"network.connect(hostId) != nullptr","");
    kj::_::Debug::Fault::fatal((Fault *)local_5f8);
  }
  body._builder.segment = (SegmentBuilder *)_kjCondition._0_8_;
  body._builder.capTable = (CapTableBuilder *)_kjCondition.op.content.ptr;
  _kjCondition.op.content.ptr = (char *)0x0;
  kj::
  Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
  ::dispose((Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
             *)&_kjCondition);
  local_598.disposer = (Disposer *)body._builder.segment;
  local_598.ptr = (Connection *)body._builder.capTable;
  body._builder.capTable = (CapTableBuilder *)0x0;
  kj::
  Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
  ::dispose((Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
             *)&body);
  (*((CapTableReader *)&(local_598.ptr)->super_Connection)->_vptr_CapTableReader[5])
            (local_598.ptr,0);
  (**((CapTableReader *)&(local_598.ptr)->super_Connection)->_vptr_CapTableReader)
            (&msg,local_598.ptr,0x80);
  (**(msg.ptr)->_vptr_OutgoingRpcMessage)(local_5f8);
  AnyPointer::Builder::initAs<capnp::rpc::Message>
            ((BuilderFor<capnp::rpc::Message> *)&_kjCondition,(Builder *)local_5f8);
  rpc::Message::Builder::initReturn(&body,(Builder *)&_kjCondition);
  *(undefined4 *)body._builder.data = 0x4d2;
  *(undefined2 *)((long)body._builder.data + 6) = 2;
  (*(msg.ptr)->_vptr_OutgoingRpcMessage[2])();
  kj::Own<capnp::OutgoingRpcMessage,_std::nullptr_t>::dispose(&msg);
  (*((CapTableReader *)&(local_598.ptr)->super_Connection)->_vptr_CapTableReader[1])
            (local_5f8 + 0x20);
  local_540 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
  ;
  puStack_538 = &DAT_0042222c;
  local_530 = (void *)0x5c00000178;
  kj::Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>::wait
            ((Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> *)local_5f8,
             local_5f8 + 0x20);
  _kjCondition.left = local_5f8._0_2_;
  _kjCondition.right = local_5f8._2_2_;
  _kjCondition._4_4_ = local_5f8._4_4_;
  _kjCondition.op.content.ptr = (char *)local_5f8._8_8_;
  local_5f8._8_8_ = (_func_int **)0x0;
  kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>::dispose
            ((Own<capnp::IncomingRpcMessage,_std::nullptr_t> *)local_5f8);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(local_5f8 + 0x20));
  if (_kjCondition.op.content.ptr != (char *)0x0) {
    body._builder.segment = (SegmentBuilder *)_kjCondition._0_8_;
    body._builder.capTable = (CapTableBuilder *)_kjCondition.op.content.ptr;
    _kjCondition.op.content.ptr = (char *)0x0;
    kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>::dispose
              ((Own<capnp::IncomingRpcMessage,_std::nullptr_t> *)&_kjCondition);
    msg.disposer = (Disposer *)body._builder.segment;
    msg.ptr = (OutgoingRpcMessage *)body._builder.capTable;
    body._builder.capTable = (CapTableBuilder *)0x0;
    kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>::dispose
              ((Own<capnp::IncomingRpcMessage,_std::nullptr_t> *)&body);
    (**(msg.ptr)->_vptr_OutgoingRpcMessage)(local_5f8);
    AnyPointer::Reader::getAs<capnp::rpc::Message>
              ((ReaderFor<capnp::rpc::Message> *)&body,(Reader *)local_5f8);
    if (body._builder.dataSize < 0x10) {
      WVar2 = UNIMPLEMENTED;
    }
    else {
      WVar2 = *body._builder.data;
    }
    _kjCondition.right = WVar2;
    _kjCondition.left = ABORT;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = WVar2 == ABORT;
    if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
      local_5d8._0_2_ = 1;
      (**(msg.ptr)->_vptr_OutgoingRpcMessage)(local_5f8);
      AnyPointer::Reader::getAs<capnp::rpc::Message>
                ((ReaderFor<capnp::rpc::Message> *)&body,(Reader *)local_5f8);
      if (body._builder.dataSize < 0x10) {
        local_5d8._14_2_ = 0;
      }
      else {
        local_5d8._14_2_ = *body._builder.data;
      }
      kj::_::Debug::
      log<char_const(&)[91],kj::_::DebugComparison<capnp::rpc::Message::Which,capnp::rpc::Message::Which>&,capnp::rpc::Message::Which,capnp::rpc::Message::Which>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0x179,ERROR,
                 "\"failed: expected \" \"(rpc::Message::ABORT) == (reply->getBody().getAs<rpc::Message>().which())\", _kjCondition, rpc::Message::ABORT, reply->getBody().getAs<rpc::Message>().which()"
                 ,(char (*) [91])
                  "failed: expected (rpc::Message::ABORT) == (reply->getBody().getAs<rpc::Message>().which())"
                 ,&_kjCondition,(Which *)(local_5f8 + 0x20),(Which *)(local_5f8 + 0x2e));
    }
    kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>::dispose
              ((Own<capnp::IncomingRpcMessage,_std::nullptr_t> *)&msg);
    (*((CapTableReader *)&(local_598.ptr)->super_Connection)->_vptr_CapTableReader[1])(&msg);
    local_558 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
    ;
    puStack_550 = &DAT_0042222c;
    local_548 = (void *)0x530000017c;
    kj::Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>::wait
              ((Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> *)local_5f8
               ,&msg);
    uVar1 = local_5f8._8_8_;
    local_5f8._8_8_ = (_func_int **)0x0;
    _kjCondition.left = local_5f8._0_2_;
    _kjCondition.right = local_5f8._2_2_;
    _kjCondition._4_4_ = local_5f8._4_4_;
    _kjCondition.op.content.ptr = (char *)0x0;
    body._builder.segment = (SegmentBuilder *)local_5f8._0_8_;
    body._builder.capTable = (CapTableBuilder *)uVar1;
    body._builder.data = &kj::none;
    body._builder.pointers = (WirePointer *)anon_var_dwarf_3d166;
    body._builder.dataSize = 5;
    body._builder.pointerCount = 0;
    body._builder._38_2_ = 0;
    kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>::dispose
              ((Own<capnp::IncomingRpcMessage,_std::nullptr_t> *)&_kjCondition);
    kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>::dispose
              ((Own<capnp::IncomingRpcMessage,_std::nullptr_t> *)local_5f8);
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&msg);
    if (((_func_int **)uVar1 != (_func_int **)0x0) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::
      log<char_const(&)[86],kj::_::DebugComparison<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,decltype(nullptr)>>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0x17c,ERROR,
                 "\"failed: expected \" \"conn->receiveIncomingMessage().wait(ioContext.waitScope) == kj::none\", _kjCondition"
                 ,(char (*) [86])
                  "failed: expected conn->receiveIncomingMessage().wait(ioContext.waitScope) == kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>,_const_kj::None_&>
                   *)&body);
    }
    kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>::dispose
              ((Own<capnp::IncomingRpcMessage,_std::nullptr_t> *)&body);
    kj::
    Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
    ::dispose(&local_598);
    MallocMessageBuilder::~MallocMessageBuilder(&refMessage);
    TwoPartyVatNetwork::~TwoPartyVatNetwork(&network);
    kj::AsyncIoProvider::PipeThread::~PipeThread(&serverThread);
    kj::AsyncIoContext::~AsyncIoContext(&ioContext);
    return;
  }
  kj::_::Debug::Fault::Fault
            ((Fault *)local_5f8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
             ,0x178,FAILED,"conn->receiveIncomingMessage().wait(ioContext.waitScope) != nullptr","")
  ;
  kj::_::Debug::Fault::fatal((Fault *)local_5f8);
}

Assistant:

TEST(TwoPartyNetwork, Abort) {
  // Verify that aborts are received.

  auto ioContext = kj::setupAsyncIo();
  int callCount = 0;
  int handleCount = 0;

  auto serverThread = runServer(*ioContext.provider, callCount, handleCount);
  TwoPartyVatNetwork network(*serverThread.pipe, rpc::twoparty::Side::CLIENT);

  MallocMessageBuilder refMessage(128);
  auto hostId = refMessage.initRoot<rpc::twoparty::VatId>();
  hostId.setSide(rpc::twoparty::Side::SERVER);

  auto conn = KJ_ASSERT_NONNULL(network.connect(hostId));
  conn->setIdle(false);

  {
    // Send an invalid message (Return to non-existent question).
    auto msg = conn->newOutgoingMessage(128);
    auto body = msg->getBody().initAs<rpc::Message>().initReturn();
    body.setAnswerId(1234);
    body.setCanceled();
    msg->send();
  }

  {
    auto reply = KJ_ASSERT_NONNULL(conn->receiveIncomingMessage().wait(ioContext.waitScope));
    EXPECT_EQ(rpc::Message::ABORT, reply->getBody().getAs<rpc::Message>().which());
  }

  EXPECT_TRUE(conn->receiveIncomingMessage().wait(ioContext.waitScope) == kj::none);
}